

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::paintEvent(QGraphicsView *this,QPaintEvent *event)

{
  uint *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QGraphicsViewPrivate *pQVar6;
  long *plVar7;
  bool bVar8;
  char cVar9;
  undefined4 uVar10;
  int iVar11;
  QWidget *pQVar12;
  undefined8 *puVar13;
  long lVar14;
  QPaintDevice *pQVar15;
  QArrayDataPointer<QPointF> *pQVar16;
  long in_FS_OFFSET;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 local_e8 [16];
  bool *local_d8;
  QArrayDataPointer<QPointF> *local_d0;
  QPainter *local_c8;
  QRectF *local_c0;
  bool viewTransformed;
  QPainter painter;
  QRectF local_a8;
  QGraphicsViewPrivate *d;
  QTransform local_80;
  long local_30;
  
  bVar17 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = *(QGraphicsViewPrivate **)(this + 8);
  d = pQVar6;
  bVar8 = QPointer::operator_cast_to_bool((QPointer *)&pQVar6->scene);
  if (bVar8) {
    lVar14 = *(long *)((pQVar6->scene).wp.value + 8);
    *(uint *)(lVar14 + 0xb8) =
         (*(uint *)(lVar14 + 0xb8) & 0xffffbfff |
         ((pQVar6->optimizationFlags).super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
          super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i & 1) << 0xe) ^ 0x4000;
    QRegion::operator=(&pQVar6->exposedRegion,(QRegion *)(event + 0x20));
    local_a8.w._0_4_ = 0xffffffff;
    local_a8.w._4_4_ = 0xffffffff;
    local_a8.h._0_4_ = 0xffffffff;
    local_a8.h._4_4_ = 0xffffffff;
    local_a8.xp._0_4_ = 0xffffffff;
    local_a8.xp._4_4_ = 0xffffffff;
    local_a8.yp._0_4_ = 0xffffffff;
    local_a8.yp._4_4_ = 0xffffffff;
    local_e8 = QRegion::boundingRect();
    mapToScene((QPolygonF *)&local_80,this,(QRect *)local_e8);
    QPolygonF::boundingRect();
    QArrayDataPointer<QPointF>::~QArrayDataPointer((QArrayDataPointer<QPointF> *)&local_80);
    _painter = &DAT_aaaaaaaaaaaaaaaa;
    pQVar12 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar15 = &pQVar12->super_QPaintDevice;
    if (pQVar12 == (QWidget *)0x0) {
      pQVar15 = (QPaintDevice *)0x0;
    }
    uVar10 = QPainter::QPainter(&painter,pQVar15);
    if ((pQVar6->rubberBanding == true) &&
       (uVar2 = (pQVar6->rubberBandRect).x1, uVar4 = (pQVar6->rubberBandRect).y1,
       uVar3 = (pQVar6->rubberBandRect).x2, uVar5 = (pQVar6->rubberBandRect).y2,
       auVar18._0_4_ = -(uint)((int)uVar3 < (int)uVar2), auVar18._4_4_ = auVar18._0_4_,
       auVar18._8_4_ = -(uint)((int)uVar5 < (int)uVar4),
       auVar18._12_4_ = -(uint)((int)uVar5 < (int)uVar4), iVar11 = movmskpd(uVar10,auVar18),
       iVar11 == 0)) {
      QPainter::save();
    }
    uVar10 = QPainter::renderHints();
    QPainter::setRenderHints(&painter,uVar10,0);
    QPainter::setRenderHints
              (&painter,(pQVar6->renderHints).super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                        super_QFlagsStorage<QPainter::RenderHint>.i,1);
    viewTransformed = isTransformed(this);
    if (viewTransformed) {
      viewportTransform(&local_80,this);
      QPainter::setWorldTransform((QTransform *)&painter,SUB81(&local_80,0));
    }
    puVar13 = (undefined8 *)QPainter::worldTransform();
    pQVar16 = (QArrayDataPointer<QPointF> *)&local_80;
    for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
      pQVar16->d = (Data *)*puVar13;
      puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
      pQVar16 = (QArrayDataPointer<QPointF> *)((long)pQVar16 + (ulong)bVar17 * -0x10 + 8);
    }
    local_e8._0_8_ = &d;
    local_d8 = &viewTransformed;
    local_e8._8_8_ = this;
    local_d0 = (QArrayDataPointer<QPointF> *)&local_80;
    local_c8 = &painter;
    local_c0 = &local_a8;
    paintEvent::anon_class_48_6_1c4006f9::operator()((anon_class_48_6_1c4006f9 *)local_e8);
    if (d->stereoEnabled == true) {
      pQVar12 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      plVar7 = *(long **)&pQVar12->field_0x8;
      cVar9 = (**(code **)(*plVar7 + 0xa0))(plVar7);
      if (cVar9 != '\0') {
        paintEvent::anon_class_48_6_1c4006f9::operator()((anon_class_48_6_1c4006f9 *)local_e8);
        (**(code **)(*plVar7 + 0xa0))(plVar7);
      }
    }
    QPainter::end();
    puVar1 = (uint *)(*(long *)((d->scene).wp.value + 8) + 0xb8);
    *puVar1 = *puVar1 | 0x4000;
    QPainter::~QPainter(&painter);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QAbstractScrollArea::paintEvent((QAbstractScrollArea *)this,event);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::paintEvent(QPaintEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene) {
        QAbstractScrollArea::paintEvent(event);
        return;
    }

    // Set up painter state protection.
    d->scene->d_func()->painterStateProtection = !(d->optimizationFlags & DontSavePainterState);

    // Determine the exposed region
    d->exposedRegion = event->region();
    QRectF exposedSceneRect = mapToScene(d->exposedRegion.boundingRect()).boundingRect();

    // Set up the painter
    QPainter painter(viewport());
#if QT_CONFIG(rubberband)
    if (d->rubberBanding && !d->rubberBandRect.isEmpty())
        painter.save();
#endif
    // Set up render hints
    painter.setRenderHints(painter.renderHints(), false);
    painter.setRenderHints(d->renderHints, true);

    // Set up viewport transform
    const bool viewTransformed = isTransformed();
    if (viewTransformed)
        painter.setWorldTransform(viewportTransform());
    const QTransform viewTransform = painter.worldTransform();

    const auto actuallyDraw = [&]() {
        // Draw background
        if (d->cacheMode & CacheBackground) {
            // Recreate the background pixmap, and flag the whole background as
            // exposed.
            if (d->mustResizeBackgroundPixmap) {
                const qreal dpr = d->viewport->devicePixelRatio();
                d->backgroundPixmap = QPixmap(viewport()->size() * dpr);
                d->backgroundPixmap.setDevicePixelRatio(dpr);
                QBrush bgBrush = viewport()->palette().brush(viewport()->backgroundRole());
                if (!bgBrush.isOpaque())
                    d->backgroundPixmap.fill(Qt::transparent);
                QPainter p(&d->backgroundPixmap);
                p.fillRect(0, 0, d->backgroundPixmap.width(), d->backgroundPixmap.height(), bgBrush);
                d->backgroundPixmapExposed = QRegion(viewport()->rect());
                d->mustResizeBackgroundPixmap = false;
            }

            // Redraw exposed areas
            if (!d->backgroundPixmapExposed.isEmpty()) {
                QPainter backgroundPainter(&d->backgroundPixmap);
                backgroundPainter.setClipRegion(d->backgroundPixmapExposed, Qt::ReplaceClip);
                if (viewTransformed)
                    backgroundPainter.setTransform(viewTransform);
                QRectF backgroundExposedSceneRect = mapToScene(d->backgroundPixmapExposed.boundingRect()).boundingRect();
                drawBackground(&backgroundPainter, backgroundExposedSceneRect);
                d->backgroundPixmapExposed = QRegion();
            }

            // Blit the background from the background pixmap
            if (viewTransformed) {
                painter.setWorldTransform(QTransform());
                painter.drawPixmap(QPoint(), d->backgroundPixmap);
                painter.setWorldTransform(viewTransform);
            } else {
                painter.drawPixmap(QPoint(), d->backgroundPixmap);
            }
        } else {
            if (!(d->optimizationFlags & DontSavePainterState))
                painter.save();

            drawBackground(&painter, exposedSceneRect);
            if (!(d->optimizationFlags & DontSavePainterState))
                painter.restore();
        }

        // Items
        if (!(d->optimizationFlags & IndirectPainting)) {
            const quint32 oldRectAdjust = d->scene->d_func()->rectAdjust;
            if (d->optimizationFlags & QGraphicsView::DontAdjustForAntialiasing)
                d->scene->d_func()->rectAdjust = 1;
            else
                d->scene->d_func()->rectAdjust = 2;
            d->scene->d_func()->drawItems(&painter, viewTransformed ? &viewTransform : nullptr,
                                          &d->exposedRegion, viewport());
            d->scene->d_func()->rectAdjust = oldRectAdjust;
            // Make sure the painter's world transform is restored correctly when
            // drawing without painter state protection (DontSavePainterState).
            // We only change the worldTransform() so there's no need to do a full-blown
            // save() and restore(). Also note that we don't have to do this in case of
            // IndirectPainting (the else branch), because in that case we always save()
            // and restore() in QGraphicsScene::drawItems().
            if (!d->scene->d_func()->painterStateProtection)
                painter.setOpacity(1.0);
            painter.setWorldTransform(viewTransform);
        } else {
            // Make sure we don't have unpolished items before we draw
            if (!d->scene->d_func()->unpolishedItems.isEmpty())
                d->scene->d_func()->_q_polishItems();
            // We reset updateAll here (after we've issued polish events)
            // so that we can discard update requests coming from polishEvent().
            d->scene->d_func()->updateAll = false;

            // Find all exposed items
            bool allItems = false;
            QList<QGraphicsItem *> itemList = d->findItems(d->exposedRegion, &allItems, viewTransform);
            if (!itemList.isEmpty()) {
                // Generate the style options.
                const int numItems = itemList.size();
                QGraphicsItem **itemArray = &itemList[0]; // Relies on QList internals, but is perfectly valid.
                QStyleOptionGraphicsItem *styleOptionArray = d->allocStyleOptionsArray(numItems);
                QTransform transform(Qt::Uninitialized);
                for (int i = 0; i < numItems; ++i) {
                    QGraphicsItem *item = itemArray[i];
                    QGraphicsItemPrivate *itemd = item->d_ptr.data();
                    itemd->initStyleOption(&styleOptionArray[i], viewTransform, d->exposedRegion, allItems);
                    // Cache the item's area in view coordinates.
                    // Note that we have to do this here in case the base class implementation
                    // (QGraphicsScene::drawItems) is not called. If it is, we'll do this
                    // operation twice, but that's the price one has to pay for using indirect
                    // painting :-/.
                    const QRectF brect = adjustedItemEffectiveBoundingRect(item);
                    if (!itemd->itemIsUntransformable()) {
                        transform = item->sceneTransform();
                        if (viewTransformed)
                            transform *= viewTransform;
                    } else {
                        transform = item->deviceTransform(viewTransform);
                    }
                    itemd->paintedViewBoundingRects.insert(d->viewport, transform.mapRect(brect).toRect());
                }
                // Draw the items.
                drawItems(&painter, numItems, itemArray, styleOptionArray);
                d->freeStyleOptionsArray(styleOptionArray);
            }
        }

        // Foreground
        drawForeground(&painter, exposedSceneRect);

    #if QT_CONFIG(rubberband)
        // Rubberband
        if (d->rubberBanding && !d->rubberBandRect.isEmpty()) {
            painter.restore();
            QStyleOptionRubberBand option;
            option.initFrom(viewport());
            option.rect = d->rubberBandRect;
            option.shape = QRubberBand::Rectangle;

            QStyleHintReturnMask mask;
            if (viewport()->style()->styleHint(QStyle::SH_RubberBand_Mask, &option, viewport(), &mask)) {
                // painter clipping for masked rubberbands
                painter.setClipRegion(mask.region, Qt::IntersectClip);
            }

            viewport()->style()->drawControl(QStyle::CE_RubberBand, &option, &painter, viewport());
        }
    #endif
    };

    actuallyDraw();

    // For stereo we want to draw everything twice, once to each buffer
    if (d->stereoEnabled) {
        QWidgetPrivate* w = QWidgetPrivate::get(viewport());
        if (w->toggleStereoTargetBuffer()) {
            actuallyDraw();
            w->toggleStereoTargetBuffer();
        }
    }

    painter.end();

    // Restore painter state protection.
    d->scene->d_func()->painterStateProtection = true;
}